

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QByteArray * QNetworkHeadersPrivate::toHttpDate(QDateTime *dt)

{
  void *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  size_t RuntimeThreshold;
  size_t i;
  QString *in_stack_ffffffffffffff38;
  qsizetype in_stack_ffffffffffffff40;
  char16_t *in_stack_ffffffffffffff48;
  QDateTime *this;
  QStringView *in_stack_ffffffffffffff50;
  QLocale *this_00;
  ulong local_58;
  QDateTime local_30 [8];
  QLocale local_28 [8];
  QDateTime local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLocale::c(local_28,in_RSI);
  QDateTime::toUTC();
  std::data<char16_t_const,32ul>((char16_t (*) [32])L"ddd, dd MMM yyyy hh:mm:ss \'GMT\'");
  for (local_58 = 0; (local_58 < 0x20 && (L"ddd, dd MMM yyyy hh:mm:ss \'GMT\'"[local_58] != L'\0'));
      local_58 = local_58 + 1) {
  }
  QStringView::QStringView<char16_t,_true>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  this_00 = local_28;
  this = local_30;
  QLocale::toString(local_20,(QStringView *)this_00);
  QString::toLatin1(in_stack_ffffffffffffff38);
  QString::~QString((QString *)0x1f53bc);
  QDateTime::~QDateTime(this);
  QLocale::~QLocale(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QNetworkHeadersPrivate::toHttpDate(const QDateTime &dt)
{
    return QLocale::c().toString(dt.toUTC(), u"ddd, dd MMM yyyy hh:mm:ss 'GMT'").toLatin1();
}